

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomColorGroup::write(DomColorGroup *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  DomColorRole **ppDVar2;
  DomColor **ppDVar3;
  size_t sVar4;
  undefined4 in_register_00000034;
  QAnyStringView *str_00;
  long in_FS_OFFSET;
  DomColor *v_1;
  QList<DomColor_*> *__range1_1;
  DomColorRole *v;
  QList<DomColorRole_*> *__range1;
  char16_t *str;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  DataPointer *in_stack_fffffffffffffec8;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffed0;
  DomColor *this_00;
  QString *in_stack_fffffffffffffed8;
  QAnyStringView *pQVar5;
  DomColorRole *in_stack_fffffffffffffee0;
  QAnyStringView *in_stack_fffffffffffffee8;
  undefined1 local_a8 [24];
  DomColor **local_90;
  const_iterator local_88;
  const_iterator local_80;
  undefined1 local_78 [24];
  DomColorRole **local_60;
  const_iterator local_58;
  const_iterator local_50;
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  str_00 = (QAnyStringView *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x1b6729);
  if (bVar1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"colorgroup",10);
    QString::QString((QString *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  }
  else {
    QString::toLower((QString *)in_stack_fffffffffffffec8);
  }
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  QXmlStreamWriter::writeStartElement(str_00);
  QString::~QString((QString *)0x1b67e5);
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffed0);
  }
  sVar4 = 0xaaaaaaaaaaaaaaaa;
  local_50.i = (DomColorRole **)0xaaaaaaaaaaaaaaaa;
  local_50 = QList<DomColorRole_*>::begin((QList<DomColorRole_*> *)in_stack_fffffffffffffed0);
  local_58.i = (DomColorRole **)0xaaaaaaaaaaaaaaaa;
  local_58 = QList<DomColorRole_*>::end((QList<DomColorRole_*> *)in_stack_fffffffffffffed0);
  while( true ) {
    local_60 = local_58.i;
    bVar1 = QList<DomColorRole_*>::const_iterator::operator!=(&local_50,local_58);
    if (!bVar1) break;
    ppDVar2 = QList<DomColorRole_*>::const_iterator::operator*(&local_50);
    in_stack_fffffffffffffee0 = *ppDVar2;
    in_stack_fffffffffffffee8 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)str_00,(size_t)in_stack_fffffffffffffee0);
    DomColorRole::write(in_stack_fffffffffffffee0,(int)in_stack_fffffffffffffee8,local_78,sVar4);
    QString::~QString((QString *)0x1b68eb);
    QList<DomColorRole_*>::const_iterator::operator++(&local_50);
  }
  sVar4 = 0xaaaaaaaaaaaaaaaa;
  local_80.i = (DomColor **)0xaaaaaaaaaaaaaaaa;
  local_80 = QList<DomColor_*>::begin((QList<DomColor_*> *)in_stack_fffffffffffffed0);
  local_88.i = (DomColor **)0xaaaaaaaaaaaaaaaa;
  local_88 = QList<DomColor_*>::end((QList<DomColor_*> *)in_stack_fffffffffffffed0);
  while( true ) {
    local_90 = local_88.i;
    bVar1 = QList<DomColor_*>::const_iterator::operator!=(&local_80,local_88);
    if (!bVar1) break;
    ppDVar3 = QList<DomColor_*>::const_iterator::operator*(&local_80);
    this_00 = *ppDVar3;
    pQVar5 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffee8,(size_t)in_stack_fffffffffffffee0);
    DomColor::write(this_00,(int)pQVar5,local_a8,sVar4);
    QString::~QString((QString *)0x1b69ed);
    QList<DomColor_*>::const_iterator::operator++(&local_80);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomColorGroup::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("colorgroup") : tagName.toLower());

    for (DomColorRole *v : m_colorRole)
        v->write(writer, u"colorrole"_s);

    for (DomColor *v : m_color)
        v->write(writer, u"color"_s);

    writer.writeEndElement();
}